

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Bool unRLE_obuf_to_output_SMALL(DState *s)

{
  byte bVar1;
  Int32 IVar2;
  uint uVar3;
  UChar k1;
  DState *s_local;
  
  if (s->blockRandomised == '\0') {
    while (s->strm->avail_out != 0) {
      if (s->state_out_len == 0) {
        if (s->nblock_used == s->save_nblock + 1) {
          return '\0';
        }
        if (s->save_nblock + 1 < s->nblock_used) {
          return '\x01';
        }
        s->state_out_len = 1;
        s->state_out_ch = (UChar)s->k0;
        if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
          return '\x01';
        }
        uVar3 = BZ2_indexIntoF(s->tPos,s->cftab);
        s->tPos = (uint)s->ll16[s->tPos] |
                  (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
        s->nblock_used = s->nblock_used + 1;
        if (s->nblock_used != s->save_nblock + 1) {
          if ((uVar3 & 0xff) == s->k0) {
            s->state_out_len = 2;
            if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
              return '\x01';
            }
            uVar3 = BZ2_indexIntoF(s->tPos,s->cftab);
            s->tPos = (uint)s->ll16[s->tPos] |
                      (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
            s->nblock_used = s->nblock_used + 1;
            if (s->nblock_used != s->save_nblock + 1) {
              if ((uVar3 & 0xff) == s->k0) {
                s->state_out_len = 3;
                if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                  return '\x01';
                }
                uVar3 = BZ2_indexIntoF(s->tPos,s->cftab);
                s->tPos = (uint)s->ll16[s->tPos] |
                          (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
                s->nblock_used = s->nblock_used + 1;
                if (s->nblock_used != s->save_nblock + 1) {
                  if ((uVar3 & 0xff) == s->k0) {
                    if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                      return '\x01';
                    }
                    uVar3 = BZ2_indexIntoF(s->tPos,s->cftab);
                    s->tPos = (uint)s->ll16[s->tPos] |
                              (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
                    s->nblock_used = s->nblock_used + 1;
                    s->state_out_len = (uVar3 & 0xff) + 4;
                    if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                      return '\x01';
                    }
                    IVar2 = BZ2_indexIntoF(s->tPos,s->cftab);
                    s->k0 = IVar2;
                    s->tPos = (uint)s->ll16[s->tPos] |
                              (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
                    s->nblock_used = s->nblock_used + 1;
                  }
                  else {
                    s->k0 = uVar3 & 0xff;
                  }
                }
              }
              else {
                s->k0 = uVar3 & 0xff;
              }
            }
          }
          else {
            s->k0 = uVar3 & 0xff;
          }
        }
      }
      else {
        *s->strm->next_out = s->state_out_ch;
        s->calculatedBlockCRC =
             s->calculatedBlockCRC << 8 ^
             BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)s->state_out_ch];
        s->state_out_len = s->state_out_len + -1;
        s->strm->next_out = s->strm->next_out + 1;
        s->strm->avail_out = s->strm->avail_out - 1;
        s->strm->total_out_lo32 = s->strm->total_out_lo32 + 1;
        if (s->strm->total_out_lo32 == 0) {
          s->strm->total_out_hi32 = s->strm->total_out_hi32 + 1;
        }
      }
    }
  }
  else {
    while (s->strm->avail_out != 0) {
      if (s->state_out_len == 0) {
        if (s->nblock_used == s->save_nblock + 1) {
          return '\0';
        }
        if (s->save_nblock + 1 < s->nblock_used) {
          return '\x01';
        }
        s->state_out_len = 1;
        s->state_out_ch = (UChar)s->k0;
        if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
          return '\x01';
        }
        IVar2 = BZ2_indexIntoF(s->tPos,s->cftab);
        s->tPos = (uint)s->ll16[s->tPos] |
                  (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
        if (s->rNToGo == 0) {
          s->rNToGo = BZ2_rNums[s->rTPos];
          s->rTPos = s->rTPos + 1;
          if (s->rTPos == 0x200) {
            s->rTPos = 0;
          }
        }
        s->rNToGo = s->rNToGo + -1;
        bVar1 = (byte)IVar2 ^ s->rNToGo == 1;
        s->nblock_used = s->nblock_used + 1;
        if (s->nblock_used != s->save_nblock + 1) {
          if ((uint)bVar1 == s->k0) {
            s->state_out_len = 2;
            if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
              return '\x01';
            }
            IVar2 = BZ2_indexIntoF(s->tPos,s->cftab);
            s->tPos = (uint)s->ll16[s->tPos] |
                      (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
            if (s->rNToGo == 0) {
              s->rNToGo = BZ2_rNums[s->rTPos];
              s->rTPos = s->rTPos + 1;
              if (s->rTPos == 0x200) {
                s->rTPos = 0;
              }
            }
            s->rNToGo = s->rNToGo + -1;
            bVar1 = (byte)IVar2 ^ s->rNToGo == 1;
            s->nblock_used = s->nblock_used + 1;
            if (s->nblock_used != s->save_nblock + 1) {
              if ((uint)bVar1 == s->k0) {
                s->state_out_len = 3;
                if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                  return '\x01';
                }
                IVar2 = BZ2_indexIntoF(s->tPos,s->cftab);
                s->tPos = (uint)s->ll16[s->tPos] |
                          (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
                if (s->rNToGo == 0) {
                  s->rNToGo = BZ2_rNums[s->rTPos];
                  s->rTPos = s->rTPos + 1;
                  if (s->rTPos == 0x200) {
                    s->rTPos = 0;
                  }
                }
                s->rNToGo = s->rNToGo + -1;
                bVar1 = (byte)IVar2 ^ s->rNToGo == 1;
                s->nblock_used = s->nblock_used + 1;
                if (s->nblock_used != s->save_nblock + 1) {
                  if ((uint)bVar1 == s->k0) {
                    if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                      return '\x01';
                    }
                    IVar2 = BZ2_indexIntoF(s->tPos,s->cftab);
                    s->tPos = (uint)s->ll16[s->tPos] |
                              (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
                    if (s->rNToGo == 0) {
                      s->rNToGo = BZ2_rNums[s->rTPos];
                      s->rTPos = s->rTPos + 1;
                      if (s->rTPos == 0x200) {
                        s->rTPos = 0;
                      }
                    }
                    s->rNToGo = s->rNToGo + -1;
                    s->nblock_used = s->nblock_used + 1;
                    s->state_out_len = (byte)((byte)IVar2 ^ s->rNToGo == 1) + 4;
                    if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                      return '\x01';
                    }
                    IVar2 = BZ2_indexIntoF(s->tPos,s->cftab);
                    s->k0 = IVar2;
                    s->tPos = (uint)s->ll16[s->tPos] |
                              (s->ll4[s->tPos >> 1] >> ((byte)(s->tPos << 2) & 4) & 0xf) << 0x10;
                    if (s->rNToGo == 0) {
                      s->rNToGo = BZ2_rNums[s->rTPos];
                      s->rTPos = s->rTPos + 1;
                      if (s->rTPos == 0x200) {
                        s->rTPos = 0;
                      }
                    }
                    s->rNToGo = s->rNToGo + -1;
                    s->k0 = (uint)(s->rNToGo == 1) ^ s->k0;
                    s->nblock_used = s->nblock_used + 1;
                  }
                  else {
                    s->k0 = (uint)bVar1;
                  }
                }
              }
              else {
                s->k0 = (uint)bVar1;
              }
            }
          }
          else {
            s->k0 = (uint)bVar1;
          }
        }
      }
      else {
        *s->strm->next_out = s->state_out_ch;
        s->calculatedBlockCRC =
             s->calculatedBlockCRC << 8 ^
             BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)s->state_out_ch];
        s->state_out_len = s->state_out_len + -1;
        s->strm->next_out = s->strm->next_out + 1;
        s->strm->avail_out = s->strm->avail_out - 1;
        s->strm->total_out_lo32 = s->strm->total_out_lo32 + 1;
        if (s->strm->total_out_lo32 == 0) {
          s->strm->total_out_hi32 = s->strm->total_out_hi32 + 1;
        }
      }
    }
  }
  return '\0';
}

Assistant:

static
Bool unRLE_obuf_to_output_SMALL ( DState* s )
{
   UChar k1;

   if (s->blockRandomised) {

      while (True) {
         /* try to finish existing run */
         while (True) {
            if (s->strm->avail_out == 0) return False;
            if (s->state_out_len == 0) break;
            *( (UChar*)(s->strm->next_out) ) = s->state_out_ch;
            BZ_UPDATE_CRC ( s->calculatedBlockCRC, s->state_out_ch );
            s->state_out_len--;
            s->strm->next_out++;
            s->strm->avail_out--;
            s->strm->total_out_lo32++;
            if (s->strm->total_out_lo32 == 0) s->strm->total_out_hi32++;
         }
   
         /* can a new run be started? */
         if (s->nblock_used == s->save_nblock+1) return False;

         /* Only caused by corrupt data stream? */
         if (s->nblock_used > s->save_nblock+1)
            return True;
   
         s->state_out_len = 1;
         s->state_out_ch = s->k0;
         BZ_GET_SMALL(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         s->state_out_len = 2;
         BZ_GET_SMALL(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         s->state_out_len = 3;
         BZ_GET_SMALL(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         BZ_GET_SMALL(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         s->state_out_len = ((Int32)k1) + 4;
         BZ_GET_SMALL(s->k0); BZ_RAND_UPD_MASK; 
         s->k0 ^= BZ_RAND_MASK; s->nblock_used++;
      }

   } else {

      while (True) {
         /* try to finish existing run */
         while (True) {
            if (s->strm->avail_out == 0) return False;
            if (s->state_out_len == 0) break;
            *( (UChar*)(s->strm->next_out) ) = s->state_out_ch;
            BZ_UPDATE_CRC ( s->calculatedBlockCRC, s->state_out_ch );
            s->state_out_len--;
            s->strm->next_out++;
            s->strm->avail_out--;
            s->strm->total_out_lo32++;
            if (s->strm->total_out_lo32 == 0) s->strm->total_out_hi32++;
         }
   
         /* can a new run be started? */
         if (s->nblock_used == s->save_nblock+1) return False;

         /* Only caused by corrupt data stream? */
         if (s->nblock_used > s->save_nblock+1)
            return True;
   
         s->state_out_len = 1;
         s->state_out_ch = s->k0;
         BZ_GET_SMALL(k1); s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         s->state_out_len = 2;
         BZ_GET_SMALL(k1); s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         s->state_out_len = 3;
         BZ_GET_SMALL(k1); s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         BZ_GET_SMALL(k1); s->nblock_used++;
         s->state_out_len = ((Int32)k1) + 4;
         BZ_GET_SMALL(s->k0); s->nblock_used++;
      }

   }
}